

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_protocol.h
# Opt level: O1

char * cppcms::http::protocol::tocken<char_const*>(char *begin,char *end)

{
  byte bVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)begin;
  if (begin < end) {
    do {
      bVar1 = *pbVar2;
      if (0x5e < (byte)(bVar1 - 0x20)) {
        return (char *)pbVar2;
      }
      if ((bVar1 - 9 < 0x38) && ((0xfe004982800001U >> ((ulong)(bVar1 - 9) & 0x3f) & 1) != 0)) {
        return (char *)pbVar2;
      }
      if ((bVar1 - 0x5b < 0x23) && ((0x500000007U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0)) {
        return (char *)pbVar2;
      }
      pbVar2 = pbVar2 + 1;
      begin = end;
    } while (pbVar2 != (byte *)end);
  }
  return begin;
}

Assistant:

It tocken(It begin,It end)
	{
		char c;
		while(begin < end && 0x20<=(c=*begin) && c<=0x7E && !separator(c))
			begin++;
		return begin;
	}